

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O0

void nni_show_backtrace(void)

{
  int iVar1;
  long lVar2;
  int local_1ac;
  int i;
  char **lines;
  undefined1 local_198 [4];
  int nframes;
  void *frames [50];
  
  iVar1 = backtrace(local_198,0x32);
  if ((1 < iVar1) && (lVar2 = backtrace_symbols(local_198,iVar1), lVar2 != 0)) {
    for (local_1ac = 1; local_1ac < iVar1; local_1ac = local_1ac + 1) {
      nni_println(*(char **)(lVar2 + (long)local_1ac * 8));
    }
  }
  return;
}

Assistant:

void
nni_show_backtrace(void)
{
#ifdef NNG_HAVE_BACKTRACE
	void *frames[50];
	int   nframes;

	nframes = backtrace(frames, sizeof(frames) / sizeof(frames[0]));
	if (nframes > 1) {
		char **lines = backtrace_symbols(frames, nframes);
		if (lines == NULL) {
			return;
		}
		for (int i = 1; i < nframes; i++) {
			nni_println(lines[i]);
		}
	}
#endif
}